

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

void __thiscall CVmObjString::CVmObjString(CVmObjString *this,char *str,size_t len)

{
  int iVar1;
  CVmVarHeap *pCVar2;
  undefined4 extraout_var;
  ulong in_RDX;
  void *in_RSI;
  CVmObject *in_RDI;
  size_t in_stack_ffffffffffffffd8;
  
  CVmObject::CVmObject(in_RDI);
  in_RDI->_vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_003cbbd0;
  if (0xffff < in_RDX) {
    in_RDI->ext_ = (char *)0x0;
    err_throw(0);
  }
  pCVar2 = CVmMemory::get_var_heap(G_mem_X);
  iVar1 = (*pCVar2->_vptr_CVmVarHeap[4])(pCVar2,in_RDX + 2,in_RDI);
  in_RDI->ext_ = (char *)CONCAT44(extraout_var,iVar1);
  vmb_put_len((char *)in_RDI,in_stack_ffffffffffffffd8);
  memcpy(in_RDI->ext_ + 2,in_RSI,in_RDX);
  return;
}

Assistant:

CVmObjString::CVmObjString(VMG_ const char *str, size_t len)
{
    /* check for the length limit */
    if (len > 65535)
    {
        ext_ = 0;
        err_throw(VMERR_STR_TOO_LONG);
    }        

    /* 
     *   allocate space for the string plus the length prefix in the
     *   variable heap 
     */
    ext_ = (char *)G_mem->get_var_heap()->alloc_mem(len + VMB_LEN, this);

    /* 
     *   store the length prefix in portable format (so that we can easily
     *   write our contents to a saved state file) 
     */
    vmb_put_len(ext_, len);

    /* copy the string's bytes */
    memcpy(ext_ + VMB_LEN, str, len);
}